

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_resolver.hpp
# Opt level: O0

results_type * __thiscall
asio::ip::basic_resolver<asio::ip::udp,_asio::any_io_executor>::resolve
          (basic_resolver<asio::ip::udp,_asio::any_io_executor> *this,query *q)

{
  io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor> *in_RSI;
  results_type *in_RDI;
  error_code ec;
  results_type *r;
  error_code *in_stack_000000a0;
  query_type *in_stack_000000a8;
  implementation_type_conflict *in_stack_000000b0;
  resolver_service<asio::ip::udp> *in_stack_000000b8;
  
  CLI::std::error_code::error_code((error_code *)in_RSI);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::get_service(in_RSI);
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::udp>,_asio::any_io_executor>
  ::get_implementation(in_RSI);
  asio::detail::resolver_service<asio::ip::udp>::resolve
            (in_stack_000000b8,in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
  asio::detail::throw_error((error_code *)in_RSI,(char *)in_RDI);
  return in_RDI;
}

Assistant:

results_type resolve(const query& q)
  {
    asio::error_code ec;
    results_type r = impl_.get_service().resolve(
        impl_.get_implementation(), q, ec);
    asio::detail::throw_error(ec, "resolve");
    return r;
  }